

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

t_int * scalarover_perf8(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  t_sample f7;
  t_sample f6;
  t_sample f5;
  t_sample f4;
  t_sample f3;
  t_sample f2;
  t_sample f1;
  t_sample f0;
  int n;
  t_sample *out;
  float *pfStack_18;
  t_float g;
  t_sample *in;
  t_int *w_local;
  
  pfStack_18 = (float *)w[1];
  out._4_4_ = *(float *)w[2];
  _f0 = (float *)w[3];
  f1 = (t_sample)w[4];
  if ((out._4_4_ != 0.0) || (NAN(out._4_4_))) {
    out._4_4_ = 1.0 / out._4_4_;
  }
  for (; f1 != 0.0; f1 = (t_sample)((int)f1 + -8)) {
    fVar1 = pfStack_18[1];
    fVar2 = pfStack_18[2];
    fVar3 = pfStack_18[3];
    fVar4 = pfStack_18[4];
    fVar5 = pfStack_18[5];
    fVar6 = pfStack_18[6];
    fVar7 = pfStack_18[7];
    *_f0 = *pfStack_18 * out._4_4_;
    _f0[1] = fVar1 * out._4_4_;
    _f0[2] = fVar2 * out._4_4_;
    _f0[3] = fVar3 * out._4_4_;
    _f0[4] = fVar4 * out._4_4_;
    _f0[5] = fVar5 * out._4_4_;
    _f0[6] = fVar6 * out._4_4_;
    _f0[7] = fVar7 * out._4_4_;
    pfStack_18 = pfStack_18 + 8;
    _f0 = _f0 + 8;
  }
  return w + 5;
}

Assistant:

t_int *scalarover_perf8(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_float g = *(t_float *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    if (g) g = 1.f / g;
    for (; n; n -= 8, in += 8, out += 8)
    {
        t_sample f0 = in[0], f1 = in[1], f2 = in[2], f3 = in[3];
        t_sample f4 = in[4], f5 = in[5], f6 = in[6], f7 = in[7];

        out[0] = f0 * g; out[1] = f1 * g; out[2] = f2 * g; out[3] = f3 * g;
        out[4] = f4 * g; out[5] = f5 * g; out[6] = f6 * g; out[7] = f7 * g;
    }
    return (w+5);
}